

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_debug.c
# Opt level: O0

int cmd_debug_store(ly_ctx **ctx,yl_opt *yo,char *posv)

{
  bool bVar1;
  int iVar2;
  uint local_2c;
  ly_bool set;
  uint32_t i;
  char *posv_local;
  yl_opt *yo_local;
  ly_ctx **ctx_local;
  
  if (posv == (char *)0x0) {
    __assert_fail("posv",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/tools/lint/cmd_debug.c"
                  ,0x6a,"int cmd_debug_store(struct ly_ctx **, struct yl_opt *, const char *)");
  }
  bVar1 = false;
  local_2c = 0;
  do {
    if (2 < local_2c) {
LAB_00109d97:
      if (!bVar1) {
        yl_log('\x01',"Unknown debug group \"%s\".",posv);
      }
      ctx_local._4_4_ = (uint)!bVar1;
      return ctx_local._4_4_;
    }
    iVar2 = strcasecmp(posv,dg[local_2c].name);
    if (iVar2 == 0) {
      yo->dbg_groups = dg[local_2c].flag | yo->dbg_groups;
      bVar1 = true;
      goto LAB_00109d97;
    }
    local_2c = local_2c + 1;
  } while( true );
}

Assistant:

int
cmd_debug_store(struct ly_ctx **ctx, struct yl_opt *yo, const char *posv)
{
    (void) ctx;
    uint32_t i;
    ly_bool set;

    assert(posv);

    set = 0;
    for (i = 0; i < DG_LENGTH; i++) {
        if (!strcasecmp(posv, dg[i].name)) {
            yo->dbg_groups |= dg[i].flag;
            set = 1;
            break;
        }
    }

    if (!set) {
        YLMSG_E("Unknown debug group \"%s\".", posv);
        return 1;
    }

    return 0;
}